

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O2

void __thiscall
Args::Arg::Arg<QLatin1String>(Arg *this,QLatin1String *name,bool isWithValue,bool isRequired)

{
  (this->super_ArgIface).m_cmdLine = (CmdLine *)0x0;
  (this->super_ArgIface)._vptr_ArgIface = (_func_int **)&PTR__Arg_00114a70;
  this->m_isWithValue = isWithValue;
  this->m_isRequired = isRequired;
  this->m_isDefined = false;
  (this->m_value).m_str.d.d = (Data *)0x0;
  (this->m_value).m_str.d.ptr = (char16_t *)0x0;
  (this->m_value).m_str.d.size = 0;
  (this->m_flag).m_str.d.d = (Data *)0x0;
  (this->m_flag).m_str.d.ptr = (char16_t *)0x0;
  (this->m_flag).m_str.d.size = 0;
  QString::QString(&(this->m_name).m_str,*name);
  QString::QString(&(this->m_valueSpecifier).m_str,"arg");
  (this->m_defaultValue).m_str.d.d = (Data *)0x0;
  (this->m_defaultValue).m_str.d.ptr = (char16_t *)0x0;
  (this->m_longDescription).m_str.d.ptr = (char16_t *)0x0;
  (this->m_longDescription).m_str.d.size = 0;
  (this->m_description).m_str.d.size = 0;
  (this->m_longDescription).m_str.d.d = (Data *)0x0;
  (this->m_description).m_str.d.d = (Data *)0x0;
  (this->m_description).m_str.d.ptr = (char16_t *)0x0;
  (this->m_defaultValue).m_str.d.size = 0;
  return;
}

Assistant:

Arg::Arg( T && name,
	bool isWithValue, bool isRequired )
	:	m_isWithValue( isWithValue )
	,	m_isRequired( isRequired )
	,	m_isDefined( false )
	,	m_name( std::forward< T > ( name ) )
	,	m_valueSpecifier( SL( "arg" ) )
{
}